

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.h
# Opt level: O0

void __thiscall CGL::Matrix3x3::Matrix3x3(Matrix3x3 *this)

{
  double *pdVar1;
  Vector3D *in_RDI;
  int j;
  int i;
  double local_38;
  Vector3D *local_18;
  int local_10;
  int local_c;
  
  local_18 = in_RDI;
  do {
    Vector3D::Vector3D(local_18);
    local_18 = local_18 + 1;
  } while (local_18 != in_RDI + 3);
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
      local_38 = 1.0;
      if (local_c != local_10) {
        local_38 = 0.0;
      }
      pdVar1 = operator()((Matrix3x3 *)0x0,(int)((ulong)local_38 >> 0x20),0);
      *pdVar1 = local_38;
    }
  }
  return;
}

Assistant:

Matrix3x3(void) { 
    for( int i = 0; i < 3; i++ ) {
      for( int j = 0; j < 3; j++ ) {
        (*this)(i,j) = (i==j) ? 1. : 0.;
      }
    }
  }